

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_375::NinjaMain::ToolGraph(NinjaMain *this,Options *options,int argc,char **argv)

{
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  bool bVar1;
  undefined8 uVar2;
  reference ppNVar3;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_100;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_f8;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_f0;
  const_iterator n;
  GraphViz graph;
  undefined1 local_68 [8];
  string err;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  char **argv_local;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  this_00 = (vector<Node_*,_std::allocator<Node_*>_> *)((long)&err.field_2 + 8);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(this_00);
  std::__cxx11::string::string((string *)local_68);
  bVar1 = CollectTargetsFromArgs(this,argc,argv,this_00,(string *)local_68);
  if (bVar1) {
    GraphViz::GraphViz((GraphViz *)&n,&this->state_,&(this->disk_interface_).super_DiskInterface);
    GraphViz::Start((GraphViz *)&n);
    local_f8._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&err.field_2 + 8));
    __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
    __normal_iterator<Node**>
              ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_f0,
               &local_f8);
    while( true ) {
      local_100._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                              ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&err.field_2 + 8));
      bVar1 = __gnu_cxx::operator!=(&local_f0,&local_100);
      if (!bVar1) break;
      ppNVar3 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_f0);
      GraphViz::AddTarget((GraphViz *)&n,*ppNVar3);
      __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_f0);
    }
    GraphViz::Finish((GraphViz *)&n);
    this_local._4_4_ = 0;
    GraphViz::~GraphViz((GraphViz *)&n);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    Error("%s",uVar2);
    this_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_68);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&err.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

int NinjaMain::ToolGraph(const Options* options, int argc, char* argv[]) {
  vector<Node*> nodes;
  string err;
  if (!CollectTargetsFromArgs(argc, argv, &nodes, &err)) {
    Error("%s", err.c_str());
    return 1;
  }

  GraphViz graph(&state_, &disk_interface_);
  graph.Start();
  for (vector<Node*>::const_iterator n = nodes.begin(); n != nodes.end(); ++n)
    graph.AddTarget(*n);
  graph.Finish();

  return 0;
}